

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Abc_NtkFrameExtend(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  long *plVar6;
  uint *__ptr;
  void *pvVar7;
  void *pvVar8;
  Vec_Ptr_t *vFanins;
  void **ppvVar9;
  char *pcVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Vec_Ptr_t *pVVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  Abc_Obj_t *pAVar18;
  Abc_Obj_t *pAVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  
  iVar1 = pNtk->nConstrs;
  if (iVar1 == 0) {
    return;
  }
  uVar2 = pNtk->vPis->nSize;
  if ((int)uVar2 < iVar1) {
    __assert_fail("Abc_NtkPiNum(pNtk) >= pNtk->nConstrs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                  ,0x111,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
  }
  uVar3 = pNtk->vPos->nSize;
  lVar16 = (long)(int)uVar3;
  if ((int)uVar3 < iVar1 * 4) {
    __assert_fail("Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                  ,0x112,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
  }
  uVar4 = pNtk->nObjCounts[7];
  __ptr = (uint *)malloc(0x10);
  uVar15 = 8;
  if (6 < uVar4 - 1) {
    uVar15 = uVar4;
  }
  __ptr[1] = 0;
  *__ptr = uVar15;
  if (uVar15 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar15 << 3);
  }
  *(void **)(__ptr + 2) = pvVar7;
  pVVar14 = pNtk->vObjs;
  if (0 < pVVar14->nSize) {
    lVar20 = 0;
    do {
      pvVar7 = pVVar14->pArray[lVar20];
      if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) {
        uVar4 = __ptr[1];
        uVar15 = *__ptr;
        if (uVar4 == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar23 = 0x10;
          }
          else {
            uVar23 = uVar15 * 2;
            if ((int)uVar23 <= (int)uVar15) goto LAB_002b17ae;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar15 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar15 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = uVar23;
        }
LAB_002b17ae:
        __ptr[1] = uVar4 + 1;
        *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar4 * 8) = pvVar7;
      }
      lVar20 = lVar20 + 1;
      pVVar14 = pNtk->vObjs;
    } while (lVar20 < pVVar14->nSize);
  }
  vFanins = (Vec_Ptr_t *)malloc(0x10);
  vFanins->nCap = 8;
  vFanins->nSize = 0;
  ppvVar9 = (void **)malloc(0x40);
  vFanins->pArray = ppvVar9;
  pVVar14 = pNtk->vPis;
  if (0 < pVVar14->nSize) {
    uVar22 = 0;
    do {
      if (uVar22 == uVar2) break;
      pAVar5 = (Abc_Obj_t *)pVVar14->pArray[uVar22];
      if ((long)uVar22 < (long)(int)uVar2 - (long)pNtk->nConstrs) {
        Abc_NtkDupObj(pNtk,pAVar5,0);
        pAVar13 = (pAVar5->field_6).pCopy;
        pcVar10 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar13,pcVar10,"_frame1");
      }
      else {
        lVar17 = uVar22 - (long)(int)uVar2;
        lVar20 = lVar16 + lVar17 * 4;
        if (lVar20 < -1) {
LAB_002b1c9d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar24 = (long)pNtk->vPos->nSize;
        if (((lVar24 <= lVar16 + lVar17 * 4 + 1) || (lVar24 <= lVar20 + 2)) ||
           (lVar24 <= lVar20 + 3)) goto LAB_002b1c9d;
        ppvVar9 = pNtk->vPos->pArray;
        pAVar13 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*ppvVar9[lVar20 + 2] + 0x20) + 8) +
                   (long)**(int **)((long)ppvVar9[lVar20 + 2] + 0x20) * 8);
        pAVar19 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*ppvVar9[lVar20 + 3] + 0x20) + 8) +
                   (long)**(int **)((long)ppvVar9[lVar20 + 3] + 0x20) * 8);
        pAVar11 = Abc_NtkCreateNodeInv
                            (pNtk,*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*ppvVar9[lVar20 + 1] + 0x20) + 8) +
                                   (long)**(int **)((long)ppvVar9[lVar20 + 1] + 0x20) * 8));
        pAVar12 = Abc_NtkCreateNodeInv(pNtk,pAVar13);
        if (vFanins->nCap < 2) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x10);
          }
          else {
            ppvVar9 = (void **)realloc(vFanins->pArray,0x10);
          }
          vFanins->pArray = ppvVar9;
          vFanins->nCap = 2;
        }
        lVar20 = 0;
        do {
          pAVar18 = pAVar5;
          if (lVar20 == 0) {
            pAVar18 = pAVar12;
          }
          vFanins->pArray[lVar20] = pAVar18;
          lVar20 = lVar20 + 1;
        } while (lVar20 == 1);
        vFanins->nSize = 2;
        pAVar12 = Abc_NtkCreateNodeAnd(pNtk,vFanins);
        if (vFanins->nCap < 2) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x10);
          }
          else {
            ppvVar9 = (void **)realloc(vFanins->pArray,0x10);
          }
          vFanins->pArray = ppvVar9;
          vFanins->nCap = 2;
        }
        lVar20 = 0;
        do {
          pAVar18 = pAVar19;
          if (lVar20 == 0) {
            pAVar18 = pAVar13;
          }
          vFanins->pArray[lVar20] = pAVar18;
          lVar20 = lVar20 + 1;
        } while (lVar20 == 1);
        vFanins->nSize = 2;
        pAVar13 = Abc_NtkCreateNodeAnd(pNtk,vFanins);
        if (vFanins->nCap < 2) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x10);
          }
          else {
            ppvVar9 = (void **)realloc(vFanins->pArray,0x10);
          }
          vFanins->pArray = ppvVar9;
          vFanins->nCap = 2;
        }
        lVar20 = 0;
        do {
          pAVar19 = pAVar13;
          if (lVar20 == 0) {
            pAVar19 = pAVar12;
          }
          vFanins->pArray[lVar20] = pAVar19;
          lVar20 = lVar20 + 1;
        } while (lVar20 == 1);
        vFanins->nSize = 2;
        pAVar13 = Abc_NtkCreateNodeOr(pNtk,vFanins);
        if (vFanins->nCap < 2) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x10);
          }
          else {
            ppvVar9 = (void **)realloc(vFanins->pArray,0x10);
          }
          vFanins->pArray = ppvVar9;
          vFanins->nCap = 2;
        }
        lVar20 = 0;
        do {
          pAVar19 = pAVar13;
          if (lVar20 == 0) {
            pAVar19 = pAVar11;
          }
          vFanins->pArray[lVar20] = pAVar19;
          lVar20 = lVar20 + 1;
        } while (lVar20 == 1);
        vFanins->nSize = 2;
        pAVar13 = Abc_NtkCreateNodeAnd(pNtk,vFanins);
        (pAVar5->field_6).pCopy = pAVar13;
      }
      uVar22 = uVar22 + 1;
      pVVar14 = pNtk->vPis;
    } while ((long)uVar22 < (long)pVVar14->nSize);
  }
  uVar2 = __ptr[1];
  lVar20 = (long)(int)uVar2;
  if (0 < lVar20) {
    lVar17 = *(long *)(__ptr + 2);
    lVar24 = 0;
    do {
      Abc_NtkDupObj(pNtk,*(Abc_Obj_t **)(lVar17 + lVar24 * 8),0);
      lVar24 = lVar24 + 1;
    } while (lVar20 != lVar24);
  }
  if (0 < (int)uVar2) {
    lVar17 = *(long *)(__ptr + 2);
    lVar24 = 0;
    do {
      plVar6 = *(long **)(lVar17 + lVar24 * 8);
      if (0 < *(int *)((long)plVar6 + 0x1c)) {
        lVar21 = 0;
        do {
          Abc_ObjAddFanin((Abc_Obj_t *)plVar6[8],
                          *(Abc_Obj_t **)
                           (*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                     (long)*(int *)(plVar6[4] + lVar21 * 4) * 8) + 0x40));
          lVar21 = lVar21 + 1;
        } while (lVar21 < *(int *)((long)plVar6 + 0x1c));
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar20);
  }
  pVVar14 = pNtk->vPos;
  if (0 < pVVar14->nSize) {
    uVar22 = 0;
    do {
      if (uVar3 == uVar22) break;
      pAVar5 = (Abc_Obj_t *)pVVar14->pArray[uVar22];
      if ((long)uVar22 < lVar16 + (long)pNtk->nConstrs * -4) {
        Abc_NtkDupObj(pNtk,pAVar5,0);
        pAVar13 = (pAVar5->field_6).pCopy;
        pcVar10 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar13,pcVar10,"_frame1");
        Abc_ObjAddFanin((pAVar5->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40));
      }
      else {
        pAVar13 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
        Abc_ObjPatchFanin(pAVar5,pAVar13,(pAVar13->field_6).pCopy);
      }
      uVar22 = uVar22 + 1;
      pVVar14 = pNtk->vPos;
    } while ((long)uVar22 < (long)pVVar14->nSize);
  }
  if (vFanins->pArray != (void **)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (void **)0x0;
  }
  free(vFanins);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkFrameExtend( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vFanins, * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pReset, * pEnable, * pSignal;
    Abc_Obj_t * pResetN, * pEnableN, * pAnd0, * pAnd1, * pMux;
    int i, k, iStartPo, nPisOld = Abc_NtkPiNum(pNtk), nPosOld = Abc_NtkPoNum(pNtk);
    // skip if there are no flops
    if ( pNtk->nConstrs == 0 )
        return;
    assert( Abc_NtkPiNum(pNtk) >= pNtk->nConstrs );
    assert( Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4 );
    // collect nodes
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vNodes, pObj );
    // duplicate PIs
    vFanins = Vec_PtrAlloc( 2 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        if ( i == nPisOld )
            break;
        if ( i < nPisOld - pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            continue;
        }
        // create flop input
        iStartPo = nPosOld + 4 * (i - nPisOld);
        pReset   = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 1 ) );
        pEnable  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 2 ) );
        pSignal  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 3 ) );
        pResetN  = Abc_NtkCreateNodeInv( pNtk, pReset );
        pEnableN = Abc_NtkCreateNodeInv( pNtk, pEnable );
        Vec_PtrFillTwo( vFanins, 2, pEnableN, pObj );
        pAnd0    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pEnable, pSignal );
        pAnd1    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pAnd0, pAnd1 );
        pMux     = Abc_NtkCreateNodeOr( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pResetN, pMux );
        pObj->pCopy = Abc_NtkCreateNodeAnd( pNtk, vFanins );
    }
    // duplicate internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_NtkDupObj( pNtk, pObj, 0 );
    // connect objects
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // create new POs and reconnect flop inputs
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i == nPosOld )
            break;
        if ( i < nPosOld - 4 * pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
            continue;
        }
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), Abc_ObjFanin0(pObj)->pCopy );
    }
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vNodes );
}